

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delimited_message_util.cc
# Opt level: O0

bool google::protobuf::util::SerializeDelimitedToCodedStream
               (MessageLite *message,CodedOutputStream *output)

{
  bool bVar1;
  uint32_t value;
  undefined4 extraout_var;
  uint8_t *target;
  uint8_t *buffer;
  size_t size;
  CodedOutputStream *output_local;
  MessageLite *message_local;
  
  value = (*message->_vptr_MessageLite[3])();
  if (CONCAT44(extraout_var,value) < 0x80000000) {
    protobuf::io::CodedOutputStream::WriteVarint32(output,value);
    target = protobuf::io::CodedOutputStream::GetDirectBufferForNBytesAndAdvance(output,value);
    if (target == (uint8_t *)0x0) {
      protobuf::MessageLite::SerializeWithCachedSizes(message,output);
      bVar1 = protobuf::io::CodedOutputStream::HadError(output);
      if (bVar1) {
        return false;
      }
    }
    else {
      protobuf::MessageLite::SerializeWithCachedSizesToArray(message,target);
    }
    message_local._7_1_ = true;
  }
  else {
    message_local._7_1_ = false;
  }
  return message_local._7_1_;
}

Assistant:

bool SerializeDelimitedToCodedStream(const MessageLite& message,
                                     io::CodedOutputStream* output) {
  // Write the size.
  size_t size = message.ByteSizeLong();
  if (size > INT_MAX) return false;

  output->WriteVarint32(static_cast<uint32_t>(size));

  // Write the content.
  uint8_t* buffer =
      output->GetDirectBufferForNBytesAndAdvance(static_cast<int>(size));
  if (buffer != nullptr) {
    // Optimization: The message fits in one buffer, so use the faster
    // direct-to-array serialization path.
    message.SerializeWithCachedSizesToArray(buffer);
  } else {
    // Slightly-slower path when the message is multiple buffers.
    message.SerializeWithCachedSizes(output);
    if (output->HadError()) return false;
  }

  return true;
}